

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

int __thiscall CTPNStmLabel::gen_code_continue(CTPNStmLabel *this,textchar_t *lbl,size_t lbl_len)

{
  int iVar1;
  CTcPrsSymtab *pCVar2;
  CTcSymbol *pCVar3;
  CTcPrsSymtab *in_RDX;
  CTPNStmEnclosing *in_RSI;
  textchar_t *in_RDI;
  
  if ((in_RSI != (CTPNStmEnclosing *)0x0) &&
     (pCVar2 = CTcCodeStream::get_goto_symtab(G_cs), pCVar2 != (CTcPrsSymtab *)0x0)) {
    CTcCodeStream::get_goto_symtab(G_cs);
    pCVar3 = CTcPrsSymtab::find(in_RDX,in_RDI,0x28acba);
    if (pCVar3 == *(CTcSymbol **)(in_RDI + 0x28)) {
      if (*(long *)(in_RDI + 0x30) != 0) {
        iVar1 = (**(code **)(**(long **)(in_RDI + 0x30) + 0xf0))();
        return iVar1;
      }
      return 0;
    }
  }
  iVar1 = CTPNStmEnclosing::gen_code_continue(in_RSI,(textchar_t *)in_RDX,(size_t)in_RDI);
  return iVar1;
}

Assistant:

int CTPNStmLabel::gen_code_continue(const textchar_t *lbl, size_t lbl_len)
{
    /* 
     *   If there's no label, inherit the default handling, since we're
     *   not a default 'continue' target.  If there's a label, and the
     *   label isn't our label, also inherit the default, since the target
     *   lies somewhere else.  
     */
    if (lbl == 0 || G_cs->get_goto_symtab() == 0
        || G_cs->get_goto_symtab()->find(lbl, lbl_len) != lbl_)
        return CTPNStmLabelBase::gen_code_continue(lbl, lbl_len);

    /* 
     *   It's a 'continue' with my label - ask my enclosed statement to do
     *   the work; return failure if I have no enclosed statement.  Note
     *   that we use a special call - generate a *labeled* continue - to
     *   let the statement know that it must perform the 'continue'
     *   itself and cannot defer to enclosing statements.  
     */
    if (stm_ != 0)
        return stm_->gen_code_labeled_continue();
    else
        return FALSE;
}